

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_setmetatable(lua_State *L)

{
  lj_lib_checktabornil(L,2);
  L->top = L->base + 2;
  lua_setmetatable(L,1);
  *(undefined4 *)((long)L->top + -4) = 0xfffffffd;
  return 1;
}

Assistant:

LJLIB_CF(debug_setmetatable)
{
  lj_lib_checktabornil(L, 2);
  L->top = L->base+2;
  lua_setmetatable(L, 1);
#if !LJ_52
  setboolV(L->top-1, 1);
#endif
  return 1;
}